

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall ViewTest::subViewsTest<false>(ViewTest *this)

{
  pointer piVar1;
  bool bVar2;
  int iVar3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var5;
  reference piVar6;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var7;
  size_t sVar8;
  undefined8 extraout_RAX;
  undefined8 uVar9;
  undefined8 extraout_RAX_00;
  logic_error *plVar10;
  ulong uVar11;
  code *pcVar12;
  int iVar13;
  undefined *puVar14;
  size_t sVar15;
  int *piVar16;
  bool bVar17;
  value_type *__val;
  long lVar18;
  View<int,_false,_std::allocator<unsigned_long>_> s;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  int local_f4;
  View<int,_false,_std::allocator<unsigned_long>_> local_f0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_b0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_a8;
  size_t local_a0;
  undefined1 local_98 [16];
  size_t *local_88;
  size_t local_70;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_58;
  unsigned_long *local_50;
  uint local_48;
  uint local_44;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_40;
  unsigned_long *local_38;
  
  _Var4._M_current = (unsigned_long *)operator_new(8);
  *_Var4._M_current = 0x18;
  piVar16 = this->data_;
  local_98._0_8_ = piVar16;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_98 + 8),_Var4,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var4._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_f0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_98);
  _Var5._M_current = (unsigned_long *)operator_new(8);
  *_Var5._M_current = 4;
  *_Var4._M_current = 1;
  local_f0.data_ = (pointer)0x0;
  local_f0.geometry_.shape_ = (size_t *)0x0;
  local_f0.geometry_.shapeStrides_ = (size_t *)0x0;
  local_f0.geometry_.strides_ = (size_t *)0x0;
  local_f0.geometry_.dimension_ = 0;
  local_f0.geometry_.size_ = 0;
  local_f0.geometry_.coordinateOrder_ = LastMajorOrder;
  local_f0.geometry_.isSimple_ = true;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_f0);
  andres::View<int,false,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_98,_Var5,_Var4,&local_f0);
  if (local_f0.geometry_.size_ == 1) {
    if (local_f0.data_ == (pointer)0x0) {
      plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)plVar10,"Assertion failed.");
      pcVar12 = std::runtime_error::~runtime_error;
      puVar14 = &std::runtime_error::typeinfo;
      goto LAB_001a101d;
    }
    if (local_f0.geometry_.dimension_ == 1) {
      local_f4 = 0;
      piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
               execute<int,int,false,std::allocator<unsigned_long>>(&local_f0,&local_f4);
      if (*piVar6 != 4) {
        plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar10,"test failed.");
        __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      operator_delete(local_f0.geometry_.shape_,local_f0.geometry_.dimension_ * 0x18);
      operator_delete(_Var5._M_current,8);
      operator_delete(local_88,local_70 * 0x18);
      operator_delete(_Var4._M_current,8);
      _Var4._M_current = (unsigned_long *)operator_new(8);
      *_Var4._M_current = 0x18;
      local_f0.data_ = (pointer)((ulong)local_f0.data_ & 0xffffffff00000000);
      local_98._0_8_ = piVar16;
      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Geometry<std::allocator<unsigned_long>> *)(local_98 + 8),_Var4,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var4._M_current + 1),(CoordinateOrder *)&local_f0,&andres::defaultOrder,
                 (allocator_type *)&local_f4);
      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_98);
      _Var5._M_current = (unsigned_long *)operator_new(8);
      *_Var5._M_current = 4;
      *_Var4._M_current = 1;
      local_f0.data_ = (pointer)0x0;
      local_f0.geometry_.shape_ = (size_t *)0x0;
      local_f0.geometry_.shapeStrides_ = (size_t *)0x0;
      local_f0.geometry_.strides_ = (size_t *)0x0;
      local_f0.geometry_.dimension_ = 0;
      local_f0.geometry_.size_ = 0;
      local_f0.geometry_.coordinateOrder_ = LastMajorOrder;
      local_f0.geometry_.isSimple_ = true;
      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_f0);
      andres::View<int,false,std::allocator<unsigned_long>>::
      view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((View<int,false,std::allocator<unsigned_long>> *)local_98,_Var5,_Var4,&local_f0);
      if (local_f0.geometry_.size_ == 1) {
        if (local_f0.data_ == (pointer)0x0) {
          plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar10,"Assertion failed.");
          pcVar12 = std::runtime_error::~runtime_error;
          puVar14 = &std::runtime_error::typeinfo;
          goto LAB_001a1081;
        }
        if (local_f0.geometry_.dimension_ == 1) {
          local_f4 = 0;
          piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                   execute<int,int,false,std::allocator<unsigned_long>>(&local_f0,&local_f4);
          if (*piVar6 != 4) {
            plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar10,"test failed.");
            __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          operator_delete(local_f0.geometry_.shape_,local_f0.geometry_.dimension_ * 0x18);
          operator_delete(_Var5._M_current,8);
          operator_delete(local_88,local_70 * 0x18);
          operator_delete(_Var4._M_current,8);
          _Var4._M_current = (unsigned_long *)operator_new(8);
          *_Var4._M_current = 0x18;
          local_98._0_8_ = piVar16;
          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Geometry<std::allocator<unsigned_long>> *)(local_98 + 8),_Var4,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var4._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                     (allocator_type *)&local_f0);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_98);
          _Var5._M_current = (unsigned_long *)operator_new(8);
          *_Var5._M_current = 4;
          *_Var4._M_current = 3;
          local_f0.data_ = (pointer)0x0;
          local_f0.geometry_.shape_ = (size_t *)0x0;
          local_f0.geometry_.shapeStrides_ = (size_t *)0x0;
          local_f0.geometry_.strides_ = (size_t *)0x0;
          local_f0.geometry_.dimension_ = 0;
          local_f0.geometry_.size_ = 0;
          local_f0.geometry_.coordinateOrder_ = LastMajorOrder;
          local_f0.geometry_.isSimple_ = true;
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_f0);
          andres::View<int,false,std::allocator<unsigned_long>>::
          view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((View<int,false,std::allocator<unsigned_long>> *)local_98,_Var5,_Var4,&local_f0
                    );
          if (local_f0.geometry_.size_ == 3) {
            if (local_f0.data_ == (pointer)0x0) {
              plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error((runtime_error *)plVar10,"Assertion failed.");
              pcVar12 = std::runtime_error::~runtime_error;
              puVar14 = &std::runtime_error::typeinfo;
              goto LAB_001a10e5;
            }
            if (local_f0.geometry_.dimension_ == 1) {
              local_f4 = 0;
              piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                       execute<int,int,false,std::allocator<unsigned_long>>(&local_f0,&local_f4);
              if (*piVar6 != 4) {
LAB_001a0be3:
                plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar10,"test failed.");
                __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              local_f4 = 1;
              piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                       execute<int,int,false,std::allocator<unsigned_long>>(&local_f0,&local_f4);
              if (*piVar6 != 5) goto LAB_001a0be3;
              local_f4 = 2;
              piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                       execute<int,int,false,std::allocator<unsigned_long>>(&local_f0,&local_f4);
              if (*piVar6 != 6) goto LAB_001a0be3;
              operator_delete(local_f0.geometry_.shape_,local_f0.geometry_.dimension_ * 0x18);
              operator_delete(_Var5._M_current,8);
              operator_delete(local_88,local_70 * 0x18);
              operator_delete(_Var4._M_current,8);
              _Var4._M_current = (unsigned_long *)operator_new(8);
              *_Var4._M_current = 0x18;
              local_f0.data_ = (pointer)((ulong)local_f0.data_ & 0xffffffff00000000);
              local_98._0_8_ = piVar16;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)(local_98 + 8),_Var4,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var4._M_current + 1),(CoordinateOrder *)&local_f0,&andres::defaultOrder
                         ,(allocator_type *)&local_f4);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_98);
              _Var5._M_current = (unsigned_long *)operator_new(8);
              *_Var5._M_current = 4;
              *_Var4._M_current = 3;
              local_f0.data_ = (pointer)0x0;
              local_f0.geometry_.shape_ = (size_t *)0x0;
              local_f0.geometry_.shapeStrides_ = (size_t *)0x0;
              local_f0.geometry_.strides_ = (size_t *)0x0;
              local_f0.geometry_.dimension_ = 0;
              local_f0.geometry_.size_ = 0;
              local_f0.geometry_.coordinateOrder_ = LastMajorOrder;
              local_f0.geometry_.isSimple_ = true;
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_f0);
              andres::View<int,false,std::allocator<unsigned_long>>::
              view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((View<int,false,std::allocator<unsigned_long>> *)local_98,_Var5,_Var4,
                         &local_f0);
              if (local_f0.geometry_.size_ == 3) {
                if (local_f0.data_ == (pointer)0x0) {
                  plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar10,"Assertion failed.");
                  pcVar12 = std::runtime_error::~runtime_error;
                  puVar14 = &std::runtime_error::typeinfo;
                  goto LAB_001a1117;
                }
                if (local_f0.geometry_.dimension_ == 1) {
                  local_f4 = 0;
                  piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                           execute<int,int,false,std::allocator<unsigned_long>>(&local_f0,&local_f4)
                  ;
                  if (*piVar6 != 4) {
LAB_001a0c15:
                    plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::logic_error::logic_error(plVar10,"test failed.");
                    __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                  }
                  local_f4 = 1;
                  piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                           execute<int,int,false,std::allocator<unsigned_long>>(&local_f0,&local_f4)
                  ;
                  if (*piVar6 != 5) goto LAB_001a0c15;
                  local_f4 = 2;
                  piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                           execute<int,int,false,std::allocator<unsigned_long>>(&local_f0,&local_f4)
                  ;
                  if (*piVar6 != 6) goto LAB_001a0c15;
                  operator_delete(local_f0.geometry_.shape_,local_f0.geometry_.dimension_ * 0x18);
                  operator_delete(_Var5._M_current,8);
                  operator_delete(local_88,local_70 * 0x18);
                  operator_delete(_Var4._M_current,8);
                  _Var4._M_current = (unsigned_long *)operator_new(0x10);
                  *_Var4._M_current = 6;
                  _Var4._M_current[1] = 4;
                  local_98._0_8_ = piVar16;
                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            ((Geometry<std::allocator<unsigned_long>> *)(local_98 + 8),_Var4,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )(_Var4._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
                             (allocator_type *)&local_f0);
                  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_98);
                  _Var5._M_current = (unsigned_long *)operator_new(0x10);
                  *_Var5._M_current = 2;
                  _Var5._M_current[1] = 2;
                  *_Var4._M_current = 1;
                  _Var4._M_current[1] = 1;
                  local_f0.data_ = (pointer)0x0;
                  local_f0.geometry_.shape_ = (size_t *)0x0;
                  local_f0.geometry_.shapeStrides_ = (size_t *)0x0;
                  local_f0.geometry_.strides_ = (size_t *)0x0;
                  local_f0.geometry_.dimension_ = 0;
                  local_f0.geometry_.size_ = 0;
                  local_f0.geometry_.coordinateOrder_ = LastMajorOrder;
                  local_f0.geometry_.isSimple_ = true;
                  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_f0)
                  ;
                  andres::View<int,false,std::allocator<unsigned_long>>::
                  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            ((View<int,false,std::allocator<unsigned_long>> *)local_98,_Var5,_Var4,
                             &local_f0);
                  if (local_f0.geometry_.size_ == 1) {
                    if (local_f0.data_ == (pointer)0x0) {
                      plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error
                                ((runtime_error *)plVar10,"Assertion failed.");
                      pcVar12 = std::runtime_error::~runtime_error;
                      puVar14 = &std::runtime_error::typeinfo;
                      goto LAB_001a1149;
                    }
                    if (local_f0.geometry_.dimension_ == 2) {
                      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                         ((View<int,false,std::allocator<unsigned_long>> *)&local_f0
                                          ,0,0);
                      if (*piVar6 != 0xe) {
                        plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar10,"test failed.");
                        __cxa_throw(plVar10,&std::logic_error::typeinfo,
                                    std::logic_error::~logic_error);
                      }
                      operator_delete(local_f0.geometry_.shape_,local_f0.geometry_.dimension_ * 0x18
                                     );
                      operator_delete(_Var5._M_current,0x10);
                      operator_delete(local_88,local_70 * 0x18);
                      operator_delete(_Var4._M_current,0x10);
                      _Var4._M_current = (unsigned_long *)operator_new(0x10);
                      *_Var4._M_current = 6;
                      _Var4._M_current[1] = 4;
                      local_f0.data_ = (pointer)((ulong)local_f0.data_ & 0xffffffff00000000);
                      local_98._0_8_ = piVar16;
                      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                ((Geometry<std::allocator<unsigned_long>> *)(local_98 + 8),_Var4,
                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )(_Var4._M_current + 2),(CoordinateOrder *)&local_f0,
                                 &andres::defaultOrder,(allocator_type *)&local_f4);
                      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_98);
                      _Var5._M_current = (unsigned_long *)operator_new(0x10);
                      *_Var5._M_current = 2;
                      _Var5._M_current[1] = 2;
                      *_Var4._M_current = 1;
                      _Var4._M_current[1] = 1;
                      local_f0.data_ = (pointer)0x0;
                      local_f0.geometry_.shape_ = (size_t *)0x0;
                      local_f0.geometry_.shapeStrides_ = (size_t *)0x0;
                      local_f0.geometry_.strides_ = (size_t *)0x0;
                      local_f0.geometry_.dimension_ = 0;
                      local_f0.geometry_.size_ = 0;
                      local_f0.geometry_.coordinateOrder_ = LastMajorOrder;
                      local_f0.geometry_.isSimple_ = true;
                      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                (&local_f0);
                      andres::View<int,false,std::allocator<unsigned_long>>::
                      view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                ((View<int,false,std::allocator<unsigned_long>> *)local_98,_Var5,
                                 _Var4,&local_f0);
                      if (local_f0.geometry_.size_ == 1) {
                        if (local_f0.data_ == (pointer)0x0) {
                          plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar10,"Assertion failed.");
                          pcVar12 = std::runtime_error::~runtime_error;
                          puVar14 = &std::runtime_error::typeinfo;
                          goto LAB_001a11ad;
                        }
                        if (local_f0.geometry_.dimension_ == 2) {
                          piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                             ((View<int,false,std::allocator<unsigned_long>> *)
                                              &local_f0,0,0);
                          if (*piVar6 != 10) {
                            plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar10,"test failed.");
                            __cxa_throw(plVar10,&std::logic_error::typeinfo,
                                        std::logic_error::~logic_error);
                          }
                          operator_delete(local_f0.geometry_.shape_,
                                          local_f0.geometry_.dimension_ * 0x18);
                          operator_delete(_Var5._M_current,0x10);
                          operator_delete(local_88,local_70 * 0x18);
                          operator_delete(_Var4._M_current,0x10);
                          _Var4._M_current = (unsigned_long *)operator_new(0x10);
                          *_Var4._M_current = 6;
                          _Var4._M_current[1] = 4;
                          local_98._0_8_ = piVar16;
                          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    ((Geometry<std::allocator<unsigned_long>> *)(local_98 + 8),_Var4
                                     ,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       )(_Var4._M_current + 2),&andres::defaultOrder,
                                     &andres::defaultOrder,(allocator_type *)&local_f0);
                          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_98);
                          _Var5._M_current = (unsigned_long *)operator_new(0x10);
                          *_Var5._M_current = 0;
                          _Var5._M_current[1] = 0;
                          *_Var4._M_current = 1;
                          _Var4._M_current[1] = 4;
                          local_f0.data_ = (pointer)0x0;
                          local_f0.geometry_.shape_ = (size_t *)0x0;
                          local_f0.geometry_.shapeStrides_ = (size_t *)0x0;
                          local_f0.geometry_.strides_ = (size_t *)0x0;
                          local_f0.geometry_.dimension_ = 0;
                          local_f0.geometry_.size_ = 0;
                          local_f0.geometry_.coordinateOrder_ = LastMajorOrder;
                          local_f0.geometry_.isSimple_ = true;
                          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                    (&local_f0);
                          andres::View<int,false,std::allocator<unsigned_long>>::
                          view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    ((View<int,false,std::allocator<unsigned_long>> *)local_98,_Var5
                                     ,_Var4,&local_f0);
                          if (local_f0.geometry_.size_ == 4) {
                            if (local_f0.data_ == (pointer)0x0) {
                              plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        ((runtime_error *)plVar10,"Assertion failed.");
                              pcVar12 = std::runtime_error::~runtime_error;
                              puVar14 = &std::runtime_error::typeinfo;
                              goto LAB_001a1211;
                            }
                            if (local_f0.geometry_.dimension_ == 2) {
                              piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::
                                       operator()((View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_f0,0,0);
                              if (*piVar6 != 0) {
LAB_001a0b7f:
                                plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::logic_error::logic_error(plVar10,"test failed.");
                                __cxa_throw(plVar10,&std::logic_error::typeinfo,
                                            std::logic_error::~logic_error);
                              }
                              piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::
                                       operator()((View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_f0,0,1);
                              if (*piVar6 != 6) goto LAB_001a0b7f;
                              piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::
                                       operator()((View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_f0,0,2);
                              if (*piVar6 != 0xc) goto LAB_001a0b7f;
                              piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::
                                       operator()((View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_f0,0,3);
                              if (*piVar6 != 0x12) goto LAB_001a0b7f;
                              operator_delete(local_f0.geometry_.shape_,
                                              local_f0.geometry_.dimension_ * 0x18);
                              operator_delete(_Var5._M_current,0x10);
                              operator_delete(local_88,local_70 * 0x18);
                              operator_delete(_Var4._M_current,0x10);
                              _Var4._M_current = (unsigned_long *)operator_new(0x10);
                              *_Var4._M_current = 6;
                              _Var4._M_current[1] = 4;
                              local_f0.data_ = (pointer)((ulong)local_f0.data_ & 0xffffffff00000000)
                              ;
                              local_98._0_8_ = piVar16;
                              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        ((Geometry<std::allocator<unsigned_long>> *)(local_98 + 8),
                                         _Var4,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var4._M_current + 2),(CoordinateOrder *)&local_f0
                                         ,&andres::defaultOrder,(allocator_type *)&local_f4);
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::
                              testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                            local_98);
                              _Var5._M_current = (unsigned_long *)operator_new(0x10);
                              *_Var5._M_current = 0;
                              _Var5._M_current[1] = 0;
                              *_Var4._M_current = 1;
                              _Var4._M_current[1] = 4;
                              local_f0.data_ = (pointer)0x0;
                              local_f0.geometry_.shape_ = (size_t *)0x0;
                              local_f0.geometry_.shapeStrides_ = (size_t *)0x0;
                              local_f0.geometry_.strides_ = (size_t *)0x0;
                              local_f0.geometry_.dimension_ = 0;
                              local_f0.geometry_.size_ = 0;
                              local_f0.geometry_.coordinateOrder_ = LastMajorOrder;
                              local_f0.geometry_.isSimple_ = true;
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::
                              testInvariant(&local_f0);
                              andres::View<int,false,std::allocator<unsigned_long>>::
                              view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        ((View<int,false,std::allocator<unsigned_long>> *)local_98,
                                         _Var5,_Var4,&local_f0);
                              if (local_f0.geometry_.size_ == 4) {
                                if (local_f0.data_ == (pointer)0x0) {
                                  plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar10,"Assertion failed.");
                                  pcVar12 = std::runtime_error::~runtime_error;
                                  puVar14 = &std::runtime_error::typeinfo;
                                  goto LAB_001a1243;
                                }
                                if (local_f0.geometry_.dimension_ == 2) {
                                  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::
                                           operator()((View<int,false,std::allocator<unsigned_long>>
                                                       *)&local_f0,0,0);
                                  if (*piVar6 != 0) {
LAB_001a0bb1:
                                    plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar10,"test failed.");
                                    __cxa_throw(plVar10,&std::logic_error::typeinfo,
                                                std::logic_error::~logic_error);
                                  }
                                  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::
                                           operator()((View<int,false,std::allocator<unsigned_long>>
                                                       *)&local_f0,0,1);
                                  if (*piVar6 != 1) goto LAB_001a0bb1;
                                  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::
                                           operator()((View<int,false,std::allocator<unsigned_long>>
                                                       *)&local_f0,0,2);
                                  if (*piVar6 != 2) goto LAB_001a0bb1;
                                  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::
                                           operator()((View<int,false,std::allocator<unsigned_long>>
                                                       *)&local_f0,0,3);
                                  if (*piVar6 != 3) goto LAB_001a0bb1;
                                  operator_delete(local_f0.geometry_.shape_,
                                                  local_f0.geometry_.dimension_ * 0x18);
                                  operator_delete(_Var5._M_current,0x10);
                                  operator_delete(local_88,local_70 * 0x18);
                                  operator_delete(_Var4._M_current,0x10);
                                  local_a8._M_current = (unsigned_long *)operator_new(0x10);
                                  *local_a8._M_current = 6;
                                  local_a8._M_current[1] = 4;
                                  local_98._0_8_ = piVar16;
                                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            ((Geometry<std::allocator<unsigned_long>> *)
                                             (local_98 + 8),local_a8,
                                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                              )(local_a8._M_current + 2),&andres::defaultOrder,
                                             &andres::defaultOrder,(allocator_type *)&local_f0);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_98);
                                  _Var5._M_current = (unsigned_long *)operator_new(0x10);
                                  _Var4._M_current = local_a8._M_current;
                                  *_Var5._M_current = 2;
                                  _Var5._M_current[1] = 1;
                                  *local_a8._M_current = 3;
                                  local_a8._M_current[1] = 2;
                                  local_f0.data_ = (pointer)0x0;
                                  local_f0.geometry_.shape_ = (size_t *)0x0;
                                  local_f0.geometry_.shapeStrides_ = (size_t *)0x0;
                                  local_f0.geometry_.strides_ = (size_t *)0x0;
                                  local_f0.geometry_.dimension_ = 0;
                                  local_f0.geometry_.size_ = 0;
                                  local_f0.geometry_.coordinateOrder_ = LastMajorOrder;
                                  local_f0.geometry_.isSimple_ = true;
                                  local_b0._M_current = _Var5._M_current;
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant(&local_f0);
                                  local_58._M_current = (unsigned_long *)piVar16;
                                  andres::View<int,false,std::allocator<unsigned_long>>::
                                  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            ((View<int,false,std::allocator<unsigned_long>> *)
                                             local_98,_Var5,_Var4,&local_f0);
                                  if (local_f0.geometry_.size_ == 6) {
                                    if (local_f0.data_ == (pointer)0x0) {
                                      plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::runtime_error::runtime_error
                                                ((runtime_error *)plVar10,"Assertion failed.");
                                      pcVar12 = std::runtime_error::~runtime_error;
                                      puVar14 = &std::runtime_error::typeinfo;
                                      goto LAB_001a1275;
                                    }
                                    if (local_f0.geometry_.dimension_ == 2) {
                                      local_a0 = 0;
                                      iVar13 = 0;
                                      bVar2 = true;
                                      do {
                                        bVar17 = bVar2;
                                        iVar3 = (int)local_a0;
                                        local_a0 = (long)iVar3 + 3;
                                        sVar15 = 0;
                                        do {
                                          piVar6 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_f0,sVar15,iVar13);
                                          if (*piVar6 != (&DAT_002389f0)[sVar15 + (long)iVar3]) {
                                            plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::logic_error::logic_error(plVar10,"test failed.");
                                            __cxa_throw(plVar10,&std::logic_error::typeinfo,
                                                        std::logic_error::~logic_error);
                                          }
                                          sVar15 = sVar15 + 1;
                                        } while (sVar15 != 3);
                                        iVar13 = 1;
                                        bVar2 = false;
                                      } while (bVar17);
                                      operator_delete(local_f0.geometry_.shape_,
                                                      local_f0.geometry_.dimension_ * 0x18);
                                      operator_delete(local_b0._M_current,0x10);
                                      operator_delete(local_88,local_70 * 0x18);
                                      operator_delete(local_a8._M_current,0x10);
                                      local_a8._M_current = (unsigned_long *)operator_new(0x10);
                                      *local_a8._M_current = 6;
                                      local_a8._M_current[1] = 4;
                                      local_f0.data_ =
                                           (pointer)((ulong)local_f0.data_ & 0xffffffff00000000);
                                      local_98._0_8_ = local_58._M_current;
                                      andres::marray_detail::Geometry<std::allocator<unsigned_long>>
                                      ::
                                      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                ((Geometry<std::allocator<unsigned_long>> *)
                                                 (local_98 + 8),local_a8,
                                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_a8._M_current + 2),
                                                 (CoordinateOrder *)&local_f0,&andres::defaultOrder,
                                                 (allocator_type *)&local_f4);
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_98);
                                      _Var5._M_current = (unsigned_long *)operator_new(0x10);
                                      _Var4._M_current = local_a8._M_current;
                                      *_Var5._M_current = 2;
                                      _Var5._M_current[1] = 1;
                                      *local_a8._M_current = 3;
                                      local_a8._M_current[1] = 2;
                                      local_f0.data_ = (pointer)0x0;
                                      local_f0.geometry_.shape_ = (size_t *)0x0;
                                      local_f0.geometry_.shapeStrides_ = (size_t *)0x0;
                                      local_f0.geometry_.strides_ = (size_t *)0x0;
                                      local_f0.geometry_.dimension_ = 0;
                                      local_f0.geometry_.size_ = 0;
                                      local_f0.geometry_.coordinateOrder_ = LastMajorOrder;
                                      local_f0.geometry_.isSimple_ = true;
                                      local_b0._M_current = _Var5._M_current;
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant(&local_f0);
                                      andres::View<int,false,std::allocator<unsigned_long>>::
                                      view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                ((View<int,false,std::allocator<unsigned_long>> *)
                                                 local_98,_Var5,_Var4,&local_f0);
                                      if (local_f0.geometry_.size_ == 6) {
                                        if (local_f0.data_ == (pointer)0x0) {
                                          plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::runtime_error::runtime_error
                                                    ((runtime_error *)plVar10,"Assertion failed.");
                                          pcVar12 = std::runtime_error::~runtime_error;
                                          puVar14 = &std::runtime_error::typeinfo;
                                          goto LAB_001a12a7;
                                        }
                                        if (local_f0.geometry_.dimension_ == 2) {
                                          local_a0 = 0;
                                          iVar13 = 0;
                                          bVar2 = true;
                                          do {
                                            bVar17 = bVar2;
                                            iVar3 = (int)local_a0;
                                            local_a0 = (long)iVar3 + 3;
                                            sVar15 = 0;
                                            do {
                                              piVar6 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_f0,sVar15,iVar13);
                                              if (*piVar6 != (&DAT_00238a10)[sVar15 + (long)iVar3])
                                              {
                                                plVar10 = (logic_error *)
                                                          __cxa_allocate_exception(0x10);
                                                std::logic_error::logic_error
                                                          (plVar10,"test failed.");
                                                __cxa_throw(plVar10,&std::logic_error::typeinfo,
                                                            std::logic_error::~logic_error);
                                              }
                                              sVar15 = sVar15 + 1;
                                            } while (sVar15 != 3);
                                            iVar13 = 1;
                                            bVar2 = false;
                                          } while (bVar17);
                                          operator_delete(local_f0.geometry_.shape_,
                                                          local_f0.geometry_.dimension_ * 0x18);
                                          operator_delete(local_b0._M_current,0x10);
                                          operator_delete(local_88,local_70 * 0x18);
                                          operator_delete(local_a8._M_current,0x10);
                                          _Var5._M_current = (unsigned_long *)operator_new(0x18);
                                          _Var4._M_current = local_58._M_current;
                                          *_Var5._M_current = 3;
                                          _Var5._M_current[1] = 4;
                                          _Var5._M_current[2] = 2;
                                          local_98._0_8_ = local_58._M_current;
                                          andres::marray_detail::
                                          Geometry<std::allocator<unsigned_long>>::
                                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((Geometry<std::allocator<unsigned_long>> *)
                                                     (local_98 + 8),_Var5,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var5._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f0)
                                          ;
                                          andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                          testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_98);
                                          _Var7._M_current = (unsigned_long *)operator_new(0x18);
                                          *_Var7._M_current = 1;
                                          _Var7._M_current[1] = 1;
                                          _Var7._M_current[2] = 0;
                                          *_Var5._M_current = 1;
                                          _Var5._M_current[1] = 1;
                                          _Var5._M_current[2] = 1;
                                          local_f0.data_ = (pointer)0x0;
                                          local_f0.geometry_.shape_ = (size_t *)0x0;
                                          local_f0.geometry_.shapeStrides_ = (size_t *)0x0;
                                          local_f0.geometry_.strides_ = (size_t *)0x0;
                                          local_f0.geometry_.dimension_ = 0;
                                          local_f0.geometry_.size_ = 0;
                                          local_f0.geometry_.coordinateOrder_ = LastMajorOrder;
                                          local_f0.geometry_.isSimple_ = true;
                                          andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                          testInvariant(&local_f0);
                                          andres::View<int,false,std::allocator<unsigned_long>>::
                                          view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((View<int,false,std::allocator<unsigned_long>>
                                                      *)local_98,_Var7,_Var5,&local_f0);
                                          if (local_f0.geometry_.size_ == 1) {
                                            if (local_f0.data_ == (pointer)0x0) {
                                              plVar10 = (logic_error *)
                                                        __cxa_allocate_exception(0x10);
                                              std::runtime_error::runtime_error
                                                        ((runtime_error *)plVar10,
                                                         "Assertion failed.");
                                              pcVar12 = std::runtime_error::~runtime_error;
                                              puVar14 = &std::runtime_error::typeinfo;
                                              goto LAB_001a12d9;
                                            }
                                            if (local_f0.geometry_.dimension_ == 3) {
                                              andres::
                                              View<int,_false,_std::allocator<unsigned_long>_>::
                                              testInvariant(&local_f0);
                                              piVar1 = local_f0.data_;
                                              if ((local_f0.data_ == (pointer)0x0) ||
                                                 (local_f0.geometry_.dimension_ != 3)) {
                                                plVar10 = (logic_error *)
                                                          __cxa_allocate_exception(0x10);
                                                std::runtime_error::runtime_error
                                                          ((runtime_error *)plVar10,
                                                           "Assertion failed.");
                                                pcVar12 = std::runtime_error::~runtime_error;
                                                puVar14 = &std::runtime_error::typeinfo;
LAB_001a1337:
                                                __cxa_throw(plVar10,puVar14,pcVar12);
                                              }
                                              andres::
                                              View<int,_false,_std::allocator<unsigned_long>_>::
                                              strides(&local_f0,0);
                                              sVar15 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_f0,3,0,0);
                                              if (piVar1[sVar15] != 4) {
                                                plVar10 = (logic_error *)
                                                          __cxa_allocate_exception(0x10);
                                                std::logic_error::logic_error
                                                          (plVar10,"test failed.");
                                                pcVar12 = std::logic_error::~logic_error;
                                                puVar14 = &std::logic_error::typeinfo;
                                                goto LAB_001a1337;
                                              }
                                              operator_delete(local_f0.geometry_.shape_,
                                                              local_f0.geometry_.dimension_ * 0x18);
                                              operator_delete(_Var7._M_current,0x18);
                                              operator_delete(local_88,local_70 * 0x18);
                                              operator_delete(_Var5._M_current,0x18);
                                              _Var5._M_current = (unsigned_long *)operator_new(0x18)
                                              ;
                                              *_Var5._M_current = 3;
                                              _Var5._M_current[1] = 4;
                                              _Var5._M_current[2] = 2;
                                              local_f0.data_ =
                                                   (pointer)((ulong)local_f0.data_ &
                                                            0xffffffff00000000);
                                              local_98._0_8_ = _Var4._M_current;
                                              andres::marray_detail::
                                              Geometry<std::allocator<unsigned_long>>::
                                              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                        ((Geometry<std::allocator<unsigned_long>> *)
                                                         (local_98 + 8),_Var5,
                                                         (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var5._M_current + 3),
                                                  (CoordinateOrder *)&local_f0,&andres::defaultOrder
                                                  ,(allocator_type *)&local_f4);
                                              andres::
                                              View<int,_false,_std::allocator<unsigned_long>_>::
                                              testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_98);
                                              _Var7._M_current = (unsigned_long *)operator_new(0x18)
                                              ;
                                              *_Var7._M_current = 1;
                                              _Var7._M_current[1] = 1;
                                              _Var7._M_current[2] = 0;
                                              *_Var5._M_current = 1;
                                              _Var5._M_current[1] = 1;
                                              _Var5._M_current[2] = 1;
                                              local_f0.data_ = (pointer)0x0;
                                              local_f0.geometry_.shape_ = (size_t *)0x0;
                                              local_f0.geometry_.shapeStrides_ = (size_t *)0x0;
                                              local_f0.geometry_.strides_ = (size_t *)0x0;
                                              local_f0.geometry_.dimension_ = 0;
                                              local_f0.geometry_.size_ = 0;
                                              local_f0.geometry_.coordinateOrder_ = LastMajorOrder;
                                              local_f0.geometry_.isSimple_ = true;
                                              andres::
                                              View<int,_false,_std::allocator<unsigned_long>_>::
                                              testInvariant(&local_f0);
                                              andres::View<int,false,std::allocator<unsigned_long>>
                                              ::
                                              view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                        ((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_98,_Var7,_Var5,&local_f0);
                                              if (local_f0.geometry_.size_ == 1) {
                                                if (local_f0.data_ == (pointer)0x0) {
                                                  plVar10 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar10,
                                                             "Assertion failed.");
                                                  pcVar12 = std::runtime_error::~runtime_error;
                                                  puVar14 = &std::runtime_error::typeinfo;
                                                  goto LAB_001a1369;
                                                }
                                                if (local_f0.geometry_.dimension_ == 3) {
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_f0);
                                                  piVar1 = local_f0.data_;
                                                  if ((local_f0.data_ == (pointer)0x0) ||
                                                     (local_f0.geometry_.dimension_ != 3)) {
                                                    plVar10 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar10,
                                                               "Assertion failed.");
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar14 = &std::runtime_error::typeinfo;
LAB_001a13c7:
                                                    __cxa_throw(plVar10,puVar14,pcVar12);
                                                  }
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_f0,0);
                                                  sVar15 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_f0,3,0,0);
                                                  if (piVar1[sVar15] != 10) {
                                                    plVar10 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar10,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar14 = &std::logic_error::typeinfo;
                                                    goto LAB_001a13c7;
                                                  }
                                                  operator_delete(local_f0.geometry_.shape_,
                                                                  local_f0.geometry_.dimension_ *
                                                                  0x18);
                                                  operator_delete(_Var7._M_current,0x18);
                                                  operator_delete(local_88,local_70 * 0x18);
                                                  operator_delete(_Var5._M_current,0x18);
                                                  _Var5._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var5._M_current = 3;
                                                  _Var5._M_current[1] = 4;
                                                  _Var5._M_current[2] = 2;
                                                  local_98._0_8_ = _Var4._M_current;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_98 + 8),_Var5,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var5._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f0)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_98);
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var7._M_current = 1;
                                                  _Var7._M_current[1] = 1;
                                                  _Var7._M_current[2] = 0;
                                                  *_Var5._M_current = 1;
                                                  _Var5._M_current[1] = 3;
                                                  _Var5._M_current[2] = 1;
                                                  local_f0.data_ = (pointer)0x0;
                                                  local_f0.geometry_.shape_ = (size_t *)0x0;
                                                  local_f0.geometry_.shapeStrides_ = (size_t *)0x0;
                                                  local_f0.geometry_.strides_ = (size_t *)0x0;
                                                  local_f0.geometry_.dimension_ = 0;
                                                  local_f0.geometry_.size_ = 0;
                                                  local_f0.geometry_.coordinateOrder_ =
                                                       LastMajorOrder;
                                                  local_f0.geometry_.isSimple_ = true;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_f0);
                                                  andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_98,_Var7,_Var5,&local_f0);
                                                  if (local_f0.geometry_.size_ == 3) {
                                                    if (local_f0.data_ == (pointer)0x0) {
                                                      plVar10 = (logic_error *)
                                                                __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar10,
                                                                 "Assertion failed.");
                                                      pcVar12 = std::runtime_error::~runtime_error;
                                                      puVar14 = &std::runtime_error::typeinfo;
                                                      goto LAB_001a13f9;
                                                    }
                                                    if (local_f0.geometry_.dimension_ == 3) {
                                                      andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_f0);
                                                  piVar1 = local_f0.data_;
                                                  if ((local_f0.data_ == (pointer)0x0) ||
                                                     (local_f0.geometry_.dimension_ != 3)) {
                                                    plVar10 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar10,
                                                               "Assertion failed.");
LAB_001a1459:
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar14 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
                                                    andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_f0,0);
                                                  sVar15 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_f0,3,0,0);
                                                  if (piVar1[sVar15] == 4) {
                                                    andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_f0);
                                                  piVar1 = local_f0.data_;
                                                  if ((local_f0.data_ == (pointer)0x0) ||
                                                     (local_f0.geometry_.dimension_ != 3)) {
                                                    plVar10 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar10,
                                                               "Assertion failed.");
                                                    goto LAB_001a1459;
                                                  }
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_f0,0);
                                                  sVar15 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_f0,3,1,0);
                                                  if (piVar1[sVar15] == 7) {
                                                    andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_f0);
                                                  piVar1 = local_f0.data_;
                                                  if ((local_f0.data_ == (pointer)0x0) ||
                                                     (local_f0.geometry_.dimension_ != 3)) {
                                                    plVar10 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar10,
                                                               "Assertion failed.");
                                                    goto LAB_001a1459;
                                                  }
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_f0,0);
                                                  sVar15 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_f0,3,2,0);
                                                  if (piVar1[sVar15] == 10) {
                                                    operator_delete(local_f0.geometry_.shape_,
                                                                    local_f0.geometry_.dimension_ *
                                                                    0x18);
                                                    operator_delete(_Var7._M_current,0x18);
                                                    operator_delete(local_88,local_70 * 0x18);
                                                    operator_delete(_Var5._M_current,0x18);
                                                    _Var5._M_current =
                                                         (unsigned_long *)operator_new(0x18);
                                                    *_Var5._M_current = 3;
                                                    _Var5._M_current[1] = 4;
                                                    _Var5._M_current[2] = 2;
                                                    local_f0.data_ =
                                                         (pointer)((ulong)local_f0.data_ &
                                                                  0xffffffff00000000);
                                                    local_98._0_8_ = _Var4._M_current;
                                                    andres::marray_detail::
                                                    Geometry<std::allocator<unsigned_long>>::
                                                                                                        
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_98 + 8),_Var5,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var5._M_current + 3),
                                                  (CoordinateOrder *)&local_f0,&andres::defaultOrder
                                                  ,(allocator_type *)&local_f4);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_98);
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var7._M_current = 1;
                                                  _Var7._M_current[1] = 1;
                                                  _Var7._M_current[2] = 0;
                                                  *_Var5._M_current = 1;
                                                  _Var5._M_current[1] = 3;
                                                  _Var5._M_current[2] = 1;
                                                  local_f0.data_ = (pointer)0x0;
                                                  local_f0.geometry_.shape_ = (size_t *)0x0;
                                                  local_f0.geometry_.shapeStrides_ = (size_t *)0x0;
                                                  local_f0.geometry_.strides_ = (size_t *)0x0;
                                                  local_f0.geometry_.dimension_ = 0;
                                                  local_f0.geometry_.size_ = 0;
                                                  local_f0.geometry_.coordinateOrder_ =
                                                       LastMajorOrder;
                                                  local_f0.geometry_.isSimple_ = true;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_f0);
                                                  andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_98,_Var7,_Var5,&local_f0);
                                                  if (local_f0.geometry_.size_ == 3) {
                                                    if (local_f0.data_ == (pointer)0x0) {
                                                      plVar10 = (logic_error *)
                                                                __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar10,
                                                                 "Assertion failed.");
                                                      pcVar12 = std::runtime_error::~runtime_error;
                                                      puVar14 = &std::runtime_error::typeinfo;
                                                      goto LAB_001a1499;
                                                    }
                                                    if (local_f0.geometry_.dimension_ == 3) {
                                                      andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_f0);
                                                  piVar1 = local_f0.data_;
                                                  if ((local_f0.data_ == (pointer)0x0) ||
                                                     (local_f0.geometry_.dimension_ != 3)) {
                                                    plVar10 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar10,
                                                               "Assertion failed.");
LAB_001a14f9:
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar14 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
                                                    andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_f0,0);
                                                  sVar15 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_f0,3,0,0);
                                                  if (piVar1[sVar15] == 10) {
                                                    andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_f0);
                                                  piVar1 = local_f0.data_;
                                                  if ((local_f0.data_ == (pointer)0x0) ||
                                                     (local_f0.geometry_.dimension_ != 3)) {
                                                    plVar10 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar10,
                                                               "Assertion failed.");
                                                    goto LAB_001a14f9;
                                                  }
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_f0,0);
                                                  sVar15 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_f0,3,1,0);
                                                  if (piVar1[sVar15] == 0xc) {
                                                    andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_f0);
                                                  piVar1 = local_f0.data_;
                                                  if ((local_f0.data_ == (pointer)0x0) ||
                                                     (local_f0.geometry_.dimension_ != 3)) {
                                                    plVar10 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar10,
                                                               "Assertion failed.");
                                                    goto LAB_001a14f9;
                                                  }
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_f0,0);
                                                  sVar15 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_f0,3,2,0);
                                                  if (piVar1[sVar15] == 0xe) {
                                                    operator_delete(local_f0.geometry_.shape_,
                                                                    local_f0.geometry_.dimension_ *
                                                                    0x18);
                                                    operator_delete(_Var7._M_current,0x18);
                                                    operator_delete(local_88,local_70 * 0x18);
                                                    operator_delete(_Var5._M_current,0x18);
                                                    local_b0._M_current =
                                                         (unsigned_long *)operator_new(0x18);
                                                    *local_b0._M_current = 3;
                                                    local_b0._M_current[1] = 4;
                                                    local_b0._M_current[2] = 2;
                                                    local_98._0_8_ = _Var4._M_current;
                                                    andres::marray_detail::
                                                    Geometry<std::allocator<unsigned_long>>::
                                                                                                        
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_98 + 8),local_b0,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_b0._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f0)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_98);
                                                  _Var5._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  _Var4._M_current = local_b0._M_current;
                                                  *_Var5._M_current = 1;
                                                  _Var5._M_current[1] = 1;
                                                  _Var5._M_current[2] = 0;
                                                  *local_b0._M_current = 2;
                                                  local_b0._M_current[1] = 3;
                                                  local_b0._M_current[2] = 1;
                                                  local_f0.data_ = (pointer)0x0;
                                                  local_f0.geometry_.shape_ = (size_t *)0x0;
                                                  local_f0.geometry_.shapeStrides_ = (size_t *)0x0;
                                                  local_f0.geometry_.strides_ = (size_t *)0x0;
                                                  local_f0.geometry_.dimension_ = 0;
                                                  local_f0.geometry_.size_ = 0;
                                                  local_f0.geometry_.coordinateOrder_ =
                                                       LastMajorOrder;
                                                  local_f0.geometry_.isSimple_ = true;
                                                  local_50 = _Var5._M_current;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_f0);
                                                  andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_98,_Var5,_Var4,&local_f0);
                                                  if (local_f0.geometry_.size_ == 6) {
                                                    if (local_f0.data_ == (pointer)0x0) {
                                                      plVar10 = (logic_error *)
                                                                __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar10,
                                                                 "Assertion failed.");
                                                      pcVar12 = std::runtime_error::~runtime_error;
                                                      puVar14 = &std::runtime_error::typeinfo;
                                                      goto LAB_001a1539;
                                                    }
                                                    if (local_f0.geometry_.dimension_ == 3) {
                                                      local_a0 = 0;
                                                      local_a8._M_current = (unsigned_long *)0x0;
                                                      do {
                                                        piVar16 = &DAT_00238a30 +
                                                                  (int)local_a8._M_current;
                                                        local_a8._M_current =
                                                             (unsigned_long *)
                                                             ((long)(int)local_a8._M_current + 2);
                                                        lVar18 = 0;
                                                        bVar2 = true;
                                                        do {
                                                          bVar17 = bVar2;
                                                          andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_f0);
                                                  piVar1 = local_f0.data_;
                                                  if ((local_f0.data_ == (pointer)0x0) ||
                                                     (local_f0.geometry_.dimension_ != 3)) {
                                                    plVar10 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar10,
                                                               "Assertion failed.");
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar14 = &std::runtime_error::typeinfo;
LAB_001a0b19:
                                                    __cxa_throw(plVar10,puVar14,pcVar12);
                                                  }
                                                  sVar15 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_f0,0);
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_f0,3,local_a0,0);
                                                  if (piVar1[sVar15 * lVar18 + sVar8] != *piVar16) {
                                                    plVar10 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar10,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar14 = &std::logic_error::typeinfo;
                                                    goto LAB_001a0b19;
                                                  }
                                                  piVar16 = piVar16 + 1;
                                                  lVar18 = 1;
                                                  bVar2 = false;
                                                  } while (bVar17);
                                                  local_a0 = local_a0 + 1;
                                                  } while (local_a0 != 3);
                                                  operator_delete(local_f0.geometry_.shape_,
                                                                  local_f0.geometry_.dimension_ *
                                                                  0x18);
                                                  operator_delete(local_50,0x18);
                                                  operator_delete(local_88,local_70 * 0x18);
                                                  operator_delete(local_b0._M_current,0x18);
                                                  local_b0._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *local_b0._M_current = 3;
                                                  local_b0._M_current[1] = 4;
                                                  local_b0._M_current[2] = 2;
                                                  local_f0.data_ =
                                                       (pointer)((ulong)local_f0.data_ &
                                                                0xffffffff00000000);
                                                  local_98._0_8_ = local_58._M_current;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_98 + 8),local_b0,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_b0._M_current + 3),
                                                  (CoordinateOrder *)&local_f0,&andres::defaultOrder
                                                  ,(allocator_type *)&local_f4);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_98);
                                                  _Var5._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  _Var4._M_current = local_b0._M_current;
                                                  *_Var5._M_current = 1;
                                                  _Var5._M_current[1] = 1;
                                                  _Var5._M_current[2] = 0;
                                                  *local_b0._M_current = 2;
                                                  local_b0._M_current[1] = 3;
                                                  local_b0._M_current[2] = 1;
                                                  local_f0.data_ = (pointer)0x0;
                                                  local_f0.geometry_.shape_ = (size_t *)0x0;
                                                  local_f0.geometry_.shapeStrides_ = (size_t *)0x0;
                                                  local_f0.geometry_.strides_ = (size_t *)0x0;
                                                  local_f0.geometry_.dimension_ = 0;
                                                  local_f0.geometry_.size_ = 0;
                                                  local_f0.geometry_.coordinateOrder_ =
                                                       LastMajorOrder;
                                                  local_f0.geometry_.isSimple_ = true;
                                                  local_50 = _Var5._M_current;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_f0);
                                                  andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_98,_Var5,_Var4,&local_f0);
                                                  if (local_f0.geometry_.size_ == 6) {
                                                    if (local_f0.data_ == (pointer)0x0) {
                                                      plVar10 = (logic_error *)
                                                                __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar10,
                                                                 "Assertion failed.");
                                                      pcVar12 = std::runtime_error::~runtime_error;
                                                      puVar14 = &std::runtime_error::typeinfo;
                                                      goto LAB_001a156b;
                                                    }
                                                    if (local_f0.geometry_.dimension_ == 3) {
                                                      local_a0 = 0;
                                                      local_a8._M_current = (unsigned_long *)0x0;
                                                      do {
                                                        piVar16 = &DAT_00238a50 +
                                                                  (int)local_a8._M_current;
                                                        local_a8._M_current =
                                                             (unsigned_long *)
                                                             ((long)(int)local_a8._M_current + 2);
                                                        lVar18 = 0;
                                                        bVar2 = true;
                                                        do {
                                                          bVar17 = bVar2;
                                                          andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_f0);
                                                  piVar1 = local_f0.data_;
                                                  if ((local_f0.data_ == (pointer)0x0) ||
                                                     (local_f0.geometry_.dimension_ != 3)) {
                                                    plVar10 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar10,
                                                               "Assertion failed.");
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar14 = &std::runtime_error::typeinfo;
LAB_001a0b77:
                                                    __cxa_throw(plVar10,puVar14,pcVar12);
                                                  }
                                                  sVar15 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_f0,0);
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_f0,3,local_a0,0);
                                                  if (piVar1[sVar15 * lVar18 + sVar8] != *piVar16) {
                                                    plVar10 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar10,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar14 = &std::logic_error::typeinfo;
                                                    goto LAB_001a0b77;
                                                  }
                                                  piVar16 = piVar16 + 1;
                                                  lVar18 = 1;
                                                  bVar2 = false;
                                                  } while (bVar17);
                                                  local_a0 = local_a0 + 1;
                                                  } while (local_a0 != 3);
                                                  operator_delete(local_f0.geometry_.shape_,
                                                                  local_f0.geometry_.dimension_ *
                                                                  0x18);
                                                  operator_delete(local_50,0x18);
                                                  operator_delete(local_88,local_70 * 0x18);
                                                  operator_delete(local_b0._M_current,0x18);
                                                  local_40._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *local_40._M_current = 3;
                                                  local_40._M_current[1] = 4;
                                                  local_40._M_current[2] = 2;
                                                  local_98._0_8_ = local_58._M_current;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_98 + 8),local_40,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_40._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_f0)
                                                  ;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_98);
                                                  _Var5._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  _Var4._M_current = local_40._M_current;
                                                  *_Var5._M_current = 1;
                                                  _Var5._M_current[1] = 1;
                                                  _Var5._M_current[2] = 0;
                                                  *local_40._M_current = 2;
                                                  local_40._M_current[1] = 2;
                                                  local_40._M_current[2] = 2;
                                                  local_f0.data_ = (pointer)0x0;
                                                  local_f0.geometry_.shape_ = (size_t *)0x0;
                                                  local_f0.geometry_.shapeStrides_ = (size_t *)0x0;
                                                  local_f0.geometry_.strides_ = (size_t *)0x0;
                                                  local_f0.geometry_.dimension_ = 0;
                                                  local_f0.geometry_.size_ = 0;
                                                  local_f0.geometry_.coordinateOrder_ =
                                                       LastMajorOrder;
                                                  local_f0.geometry_.isSimple_ = true;
                                                  local_38 = _Var5._M_current;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_f0);
                                                  andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_98,_Var5,_Var4,&local_f0);
                                                  if (local_f0.geometry_.size_ == 8) {
                                                    if (local_f0.data_ == (pointer)0x0) {
                                                      plVar10 = (logic_error *)
                                                                __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar10,
                                                                 "Assertion failed.");
                                                      pcVar12 = std::runtime_error::~runtime_error;
                                                      puVar14 = &std::runtime_error::typeinfo;
                                                      goto LAB_001a159d;
                                                    }
                                                    if (local_f0.geometry_.dimension_ == 3) {
                                                      local_a8._M_current = (unsigned_long *)0x0;
                                                      uVar9 = CONCAT71((int7)((ulong)extraout_RAX >>
                                                                             8),1);
                                                      uVar11 = 0;
                                                      do {
                                                        local_44 = (uint)uVar9;
                                                        local_48 = (int)uVar11 + 4;
                                                        local_b0._M_current._0_4_ =
                                                             (int)CONCAT71((uint7)(uint3)(local_48 
                                                  >> 8),1);
                                                  local_a0 = 0;
                                                  local_50 = (unsigned_long *)uVar11;
                                                  do {
                                                    piVar16 = &DAT_00238bd0 + (int)local_50;
                                                    local_50 = (unsigned_long *)
                                                               (ulong)((int)local_50 + 2);
                                                    lVar18 = 0;
                                                    bVar2 = true;
                                                    do {
                                                      bVar17 = bVar2;
                                                      andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_f0);
                                                  piVar1 = local_f0.data_;
                                                  if ((local_f0.data_ == (pointer)0x0) ||
                                                     (local_f0.geometry_.dimension_ != 3)) {
                                                    plVar10 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar10,
                                                               "Assertion failed.");
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar14 = &std::runtime_error::typeinfo;
LAB_001a09f9:
                                                    __cxa_throw(plVar10,puVar14,pcVar12);
                                                  }
                                                  sVar15 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_f0,0);
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_f0,3,local_a0,
                                                             (int)local_a8._M_current);
                                                  if (piVar1[sVar15 * lVar18 + sVar8] != *piVar16) {
                                                    plVar10 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar10,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar14 = &std::logic_error::typeinfo;
                                                    goto LAB_001a09f9;
                                                  }
                                                  piVar16 = piVar16 + 1;
                                                  lVar18 = 1;
                                                  bVar2 = false;
                                                  } while (bVar17);
                                                  local_a0 = 1;
                                                  uVar11 = (ulong)local_b0._M_current & 1;
                                                  local_b0._M_current =
                                                       local_b0._M_current & 0xffffffff00000000;
                                                  } while (uVar11 != 0);
                                                  local_a8._M_current = (unsigned_long *)0x1;
                                                  uVar9 = 0;
                                                  uVar11 = (ulong)local_48;
                                                  } while ((local_44 & 1) != 0);
                                                  operator_delete(local_f0.geometry_.shape_,
                                                                  local_f0.geometry_.dimension_ *
                                                                  0x18);
                                                  operator_delete(local_38,0x18);
                                                  operator_delete(local_88,local_70 * 0x18);
                                                  operator_delete(local_40._M_current,0x18);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var4._M_current = 3;
                                                  _Var4._M_current[1] = 4;
                                                  _Var4._M_current[2] = 2;
                                                  local_f0.data_ =
                                                       (pointer)((ulong)local_f0.data_ &
                                                                0xffffffff00000000);
                                                  local_98._0_8_ = local_58._M_current;
                                                  local_58._M_current = _Var4._M_current;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_98 + 8),_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 3),
                                                  (CoordinateOrder *)&local_f0,&andres::defaultOrder
                                                  ,(allocator_type *)&local_f4);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_98);
                                                  _Var5._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  _Var4._M_current = local_58._M_current;
                                                  *_Var5._M_current = 1;
                                                  _Var5._M_current[1] = 1;
                                                  _Var5._M_current[2] = 0;
                                                  *local_58._M_current = 2;
                                                  local_58._M_current[1] = 2;
                                                  local_58._M_current[2] = 2;
                                                  local_f0.data_ = (pointer)0x0;
                                                  local_f0.geometry_.shape_ = (size_t *)0x0;
                                                  local_f0.geometry_.shapeStrides_ = (size_t *)0x0;
                                                  local_f0.geometry_.strides_ = (size_t *)0x0;
                                                  local_f0.geometry_.dimension_ = 0;
                                                  local_f0.geometry_.size_ = 0;
                                                  local_f0.geometry_.coordinateOrder_ =
                                                       LastMajorOrder;
                                                  local_f0.geometry_.isSimple_ = true;
                                                  local_40._M_current = _Var5._M_current;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_f0);
                                                  andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_98,_Var5,_Var4,&local_f0);
                                                  if (local_f0.geometry_.size_ == 8) {
                                                    if (local_f0.data_ == (pointer)0x0) {
                                                      plVar10 = (logic_error *)
                                                                __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar10,
                                                                 "Assertion failed.");
                                                      pcVar12 = std::runtime_error::~runtime_error;
                                                      puVar14 = &std::runtime_error::typeinfo;
                                                      goto LAB_001a15cf;
                                                    }
                                                    if (local_f0.geometry_.dimension_ == 3) {
                                                      local_a8._M_current = (unsigned_long *)0x0;
                                                      uVar9 = CONCAT71((int7)((ulong)extraout_RAX_00
                                                                             >> 8),1);
                                                      uVar11 = 0;
                                                      do {
                                                        local_44 = (uint)uVar9;
                                                        local_48 = (int)uVar11 + 4;
                                                        local_b0._M_current._0_4_ =
                                                             (int)CONCAT71((uint7)(uint3)(local_48 
                                                  >> 8),1);
                                                  local_a0 = 0;
                                                  local_50 = (unsigned_long *)uVar11;
                                                  do {
                                                    piVar16 = &DAT_00238bf0 + (int)local_50;
                                                    local_50 = (unsigned_long *)
                                                               (ulong)((int)local_50 + 2);
                                                    lVar18 = 0;
                                                    bVar2 = true;
                                                    do {
                                                      bVar17 = bVar2;
                                                      andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_f0);
                                                  piVar1 = local_f0.data_;
                                                  if ((local_f0.data_ == (pointer)0x0) ||
                                                     (local_f0.geometry_.dimension_ != 3)) {
                                                    plVar10 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar10,
                                                               "Assertion failed.");
                                                    pcVar12 = std::runtime_error::~runtime_error;
                                                    puVar14 = &std::runtime_error::typeinfo;
LAB_001a0a57:
                                                    __cxa_throw(plVar10,puVar14,pcVar12);
                                                  }
                                                  sVar15 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_f0,0);
                                                  sVar8 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_f0,3,local_a0,
                                                             (int)local_a8._M_current);
                                                  if (piVar1[sVar15 * lVar18 + sVar8] != *piVar16) {
                                                    plVar10 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar10,"test failed.");
                                                    pcVar12 = std::logic_error::~logic_error;
                                                    puVar14 = &std::logic_error::typeinfo;
                                                    goto LAB_001a0a57;
                                                  }
                                                  piVar16 = piVar16 + 1;
                                                  lVar18 = 1;
                                                  bVar2 = false;
                                                  } while (bVar17);
                                                  local_a0 = 1;
                                                  uVar11 = (ulong)local_b0._M_current & 1;
                                                  local_b0._M_current =
                                                       local_b0._M_current & 0xffffffff00000000;
                                                  } while (uVar11 != 0);
                                                  local_a8._M_current = (unsigned_long *)0x1;
                                                  uVar9 = 0;
                                                  uVar11 = (ulong)local_48;
                                                  if ((local_44 & 1) == 0) {
                                                    operator_delete(local_f0.geometry_.shape_,
                                                                    local_f0.geometry_.dimension_ *
                                                                    0x18);
                                                    operator_delete(local_40._M_current,0x18);
                                                    operator_delete(local_88,local_70 * 0x18);
                                                    operator_delete(local_58._M_current,0x18);
                                                    return;
                                                  }
                                                  } while( true );
                                                  }
                                                  }
                                                  plVar10 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar10,"test failed.");
                                                  pcVar12 = std::logic_error::~logic_error;
                                                  puVar14 = &std::logic_error::typeinfo;
LAB_001a15cf:
                                                  __cxa_throw(plVar10,puVar14,pcVar12);
                                                  }
                                                  }
                                                  plVar10 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar10,"test failed.");
                                                  pcVar12 = std::logic_error::~logic_error;
                                                  puVar14 = &std::logic_error::typeinfo;
LAB_001a159d:
                                                  __cxa_throw(plVar10,puVar14,pcVar12);
                                                  }
                                                  }
                                                  plVar10 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar10,"test failed.");
                                                  pcVar12 = std::logic_error::~logic_error;
                                                  puVar14 = &std::logic_error::typeinfo;
LAB_001a156b:
                                                  __cxa_throw(plVar10,puVar14,pcVar12);
                                                  }
                                                  }
                                                  plVar10 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar10,"test failed.");
                                                  pcVar12 = std::logic_error::~logic_error;
                                                  puVar14 = &std::logic_error::typeinfo;
LAB_001a1539:
                                                  __cxa_throw(plVar10,puVar14,pcVar12);
                                                  }
                                                  }
                                                  }
                                                  plVar10 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar10,"test failed.");
                                                  pcVar12 = std::logic_error::~logic_error;
                                                  puVar14 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar10,puVar14,pcVar12);
                                                  }
                                                  }
                                                  plVar10 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar10,"test failed.");
                                                  pcVar12 = std::logic_error::~logic_error;
                                                  puVar14 = &std::logic_error::typeinfo;
LAB_001a1499:
                                                  __cxa_throw(plVar10,puVar14,pcVar12);
                                                  }
                                                  }
                                                  }
                                                  plVar10 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar10,"test failed.");
                                                  pcVar12 = std::logic_error::~logic_error;
                                                  puVar14 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar10,puVar14,pcVar12);
                                                  }
                                                  }
                                                  plVar10 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar10,"test failed.");
                                                  pcVar12 = std::logic_error::~logic_error;
                                                  puVar14 = &std::logic_error::typeinfo;
LAB_001a13f9:
                                                  __cxa_throw(plVar10,puVar14,pcVar12);
                                                }
                                              }
                                              plVar10 = (logic_error *)
                                                        __cxa_allocate_exception(0x10);
                                              std::logic_error::logic_error(plVar10,"test failed.");
                                              pcVar12 = std::logic_error::~logic_error;
                                              puVar14 = &std::logic_error::typeinfo;
LAB_001a1369:
                                              __cxa_throw(plVar10,puVar14,pcVar12);
                                            }
                                          }
                                          plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::logic_error::logic_error(plVar10,"test failed.");
                                          pcVar12 = std::logic_error::~logic_error;
                                          puVar14 = &std::logic_error::typeinfo;
LAB_001a12d9:
                                          __cxa_throw(plVar10,puVar14,pcVar12);
                                        }
                                      }
                                      plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar10,"test failed.");
                                      pcVar12 = std::logic_error::~logic_error;
                                      puVar14 = &std::logic_error::typeinfo;
LAB_001a12a7:
                                      __cxa_throw(plVar10,puVar14,pcVar12);
                                    }
                                  }
                                  plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar10,"test failed.");
                                  pcVar12 = std::logic_error::~logic_error;
                                  puVar14 = &std::logic_error::typeinfo;
LAB_001a1275:
                                  __cxa_throw(plVar10,puVar14,pcVar12);
                                }
                              }
                              plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar10,"test failed.");
                              pcVar12 = std::logic_error::~logic_error;
                              puVar14 = &std::logic_error::typeinfo;
LAB_001a1243:
                              __cxa_throw(plVar10,puVar14,pcVar12);
                            }
                          }
                          plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::logic_error::logic_error(plVar10,"test failed.");
                          pcVar12 = std::logic_error::~logic_error;
                          puVar14 = &std::logic_error::typeinfo;
LAB_001a1211:
                          __cxa_throw(plVar10,puVar14,pcVar12);
                        }
                      }
                      plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar10,"test failed.");
                      pcVar12 = std::logic_error::~logic_error;
                      puVar14 = &std::logic_error::typeinfo;
LAB_001a11ad:
                      __cxa_throw(plVar10,puVar14,pcVar12);
                    }
                  }
                  plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar10,"test failed.");
                  pcVar12 = std::logic_error::~logic_error;
                  puVar14 = &std::logic_error::typeinfo;
LAB_001a1149:
                  __cxa_throw(plVar10,puVar14,pcVar12);
                }
              }
              plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar10,"test failed.");
              pcVar12 = std::logic_error::~logic_error;
              puVar14 = &std::logic_error::typeinfo;
LAB_001a1117:
              __cxa_throw(plVar10,puVar14,pcVar12);
            }
          }
          plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar10,"test failed.");
          pcVar12 = std::logic_error::~logic_error;
          puVar14 = &std::logic_error::typeinfo;
LAB_001a10e5:
          __cxa_throw(plVar10,puVar14,pcVar12);
        }
      }
      plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar10,"test failed.");
      pcVar12 = std::logic_error::~logic_error;
      puVar14 = &std::logic_error::typeinfo;
LAB_001a1081:
      __cxa_throw(plVar10,puVar14,pcVar12);
    }
  }
  plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar10,"test failed.");
  pcVar12 = std::logic_error::~logic_error;
  puVar14 = &std::logic_error::typeinfo;
LAB_001a101d:
  __cxa_throw(plVar10,puVar14,pcVar12);
}

Assistant:

void ViewTest::subViewsTest(){
    // 1D with...
    {
        // scalar sub-view
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(1);
            base[0] = 4;
            shape[0] = 1;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(),  s);

            test(s.size() == 1 && s.dimension()==1
            );
            test(s(0)==4);
        }
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(1);
            base[0] = 4;
            shape[0] = 1;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(),  s);

            test(s.size() == 1 && s.dimension()==1
            );
            test(s(0)==4);

        }
        // 1D sub-view
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(1);
            base[0] = 4;
            shape[0] = 3;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(),  s);

            test(s.size() == 3 && s.dimension()==1
            );
            test(s(0)==4 && s(1)==5 && s(2)==6);
        }
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(1);
            base[0] = 4;
            shape[0] = 3;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(),  s);

            test(s.size() == 3 && s.dimension()==1
            );
            test(s(0)==4 && s(1)==5 && s(2)==6);
        }
    }
    // 2D with...
    {
        // scalar sub-view
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6; 
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(2);
            base[0] =2;
            base[1] =2;
            shape[0] = 1; 
            shape[1] = 1;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 1 && s.dimension()==2
            );
            test(s(0,0)==14);
        } 
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6; 
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(2);
            base[0] =2;
            base[1] =2;
            shape[0] = 1; 
            shape[1] = 1;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 1 && s.dimension()==2
            );
            test(s(0,0)==10);
        }     
        // 1D sub-view
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6; 
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(2);
            base[0] =0;
            base[1] =0;
            shape[0] = 1; 
            shape[1] = 4;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 4 && s.dimension()==2
            );
            test(s(0,0)==0 && s(0,1)==6 && s(0,2)==12 && s(0,3)==18 );
        } 
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6; 
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(2);
            base[0] =0;
            base[1] =0;
            shape[0] = 1; 
            shape[1] = 4;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 4 && s.dimension()==2
            );
            test(s(0,0)==0 && s(0,1)==1 && s(0,2)==2 && s(0,3)==3);
        } 
        // 2D sub-view
        {
            int list[] = {8, 9, 10, 14, 15, 16};
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(2);
            base[0] = 2;
            base[1] = 1;
            shape[0] = 3;
            shape[1] = 2; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 6 && s.dimension()==2
            );
            int index = 0; 
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 3; ++x){
                test(s(x, y) == list[index]);
                ++index;
            }
        } 
        {
            int list[] = {9, 13, 17, 10, 14, 18};
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(2);
            base[0] = 2;
            base[1] = 1;
            shape[0] = 3;
            shape[1] = 2; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 6 && s.dimension()==2
            );
            int index = 0; 
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 3; ++x){
                test(s(x, y) == list[index]);
                ++index;
            }
        } 
    }
    // 3D with...
    {
        // scalar sub-view
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0; 
            shape[0] = 1;
            shape[1] = 1;
            shape[2] = 1; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 1 && s.dimension()==3
            );
            test(s(0,0,0)==4);
        }
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0; 
            shape[0] = 1;
            shape[1] = 1;
            shape[2] = 1; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 1 && s.dimension()==3
            );
            test(s(0,0,0)==10);
        }
        // 1D sub-view
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0; 
            shape[0] = 1;
            shape[1] = 3;
            shape[2] = 1; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 3 && s.dimension()==3
            );
            test(s(0,0,0)==4 && s(0,1,0)==7 && s(0,2,0)==10);
        }
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0; 
            shape[0] = 1;
            shape[1] = 3;
            shape[2] = 1; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 3 && s.dimension()==3
            );
            test(s(0,0,0)==10 && s(0,1,0)==12 && s(0,2,0)==14);
        }
        // 2D sub-view
        {
            int list[] = {4, 5, 7, 8, 10, 11};
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0; 
            shape[0] = 2;
            shape[1] = 3;
            shape[2] = 1; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 6 && s.dimension()==3
            );
            int index = 0; 
            for(int z = 0; z < 1; ++z)
            for(int y = 0; y < 3; ++y)
            for(int x = 0; x < 2; ++x){
                test(s(x, y, z) == list[index]);
                ++index;
            }
        }
        {
            int list[] = {10, 18, 12, 20, 14, 22};
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0; 
            shape[0] = 2;
            shape[1] = 3;
            shape[2] = 1; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 6 && s.dimension()==3
            );
            int index = 0; 
            for(int z = 0; z < 1; ++z)
            for(int y = 0; y < 3; ++y)
            for(int x = 0; x < 2; ++x){
                test(s(x, y, z) == list[index]);
                ++index;
            }
        }
        // 3D sub-view
        {
            int list[] = {4, 5, 7, 8, 16, 17, 19, 20};
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0;
            shape[0] =2;
            shape[1] =2;
            shape[2] =2;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 8 && s.dimension()==3
            );
            int index = 0; 
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 2; ++x){
                test(s(x, y, z) == list[index]);
                ++index;
            }
        } 
        {
            int list[] = {10, 18, 12, 20, 11, 19, 13, 21};
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0;
            shape[0] =2;
            shape[1] =2;
            shape[2] =2;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 8 && s.dimension()==3
            );
            int index = 0; 
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 2; ++x){
                test(s(x, y, z) == list[index]);
                ++index;
            }
        } 
    }
}